

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_gap(REF_GEOM ref_geom,REF_INT node,REF_DBL *gap)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_INT local_c4;
  REF_DBL local_c0;
  REF_INT local_a4;
  int local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  int local_94;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_edge;
  REF_BOOL has_node;
  REF_DBL gap_xyz [3];
  double local_58;
  REF_DBL face_xyz [3];
  REF_DBL dist;
  REF_INT local_30;
  REF_INT type;
  REF_INT geom;
  REF_INT item;
  REF_DBL *gap_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  *gap = 0.0;
  ref_geom_local._4_4_ = ref_geom_is_a(ref_geom,node,0,&ref_private_macro_code_rss);
  if (ref_geom_local._4_4_ == 0) {
    ref_geom_local._4_4_ = ref_geom_is_a(ref_geom,node,1,&ref_private_macro_code_rss_1);
    if (ref_geom_local._4_4_ == 0) {
      if (ref_private_macro_code_rss_1 == 0) {
        ref_geom_local._4_4_ = 0;
      }
      else {
        if (ref_private_macro_code_rss == 0) {
          dist._4_4_ = 2;
        }
        else {
          dist._4_4_ = 0;
        }
        if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
          local_94 = -1;
        }
        else {
          local_94 = ref_geom->ref_adj->first[node];
        }
        type = local_94;
        if (local_94 == -1) {
          local_98 = -1;
        }
        else {
          local_98 = ref_geom->ref_adj->item[local_94].ref;
        }
        local_30 = local_98;
        while (type != -1) {
          if ((dist._4_4_ == ref_geom->descr[local_30 * 6]) &&
             (uVar1 = ref_egads_eval(ref_geom,local_30,(REF_DBL *)&has_edge,(REF_DBL *)0x0),
             uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0xefe,"ref_egads_gap",(ulong)uVar1,"eval");
            return uVar1;
          }
          type = ref_geom->ref_adj->item[type].next;
          if (type == -1) {
            local_9c = -1;
          }
          else {
            local_9c = ref_geom->ref_adj->item[type].ref;
          }
          local_30 = local_9c;
        }
        if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
          local_a0 = -1;
        }
        else {
          local_a0 = ref_geom->ref_adj->first[node];
        }
        type = local_a0;
        if (local_a0 == -1) {
          local_a4 = -1;
        }
        else {
          local_a4 = ref_geom->ref_adj->item[local_a0].ref;
        }
        local_30 = local_a4;
        while (type != -1) {
          if (ref_geom->descr[local_30 * 6] == 2) {
            uVar1 = ref_egads_eval(ref_geom,local_30,&local_58,(REF_DBL *)0x0);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                     ,0xf04,"ref_egads_gap",(ulong)uVar1,"eval");
              return uVar1;
            }
            dVar2 = pow(local_58 - _has_edge,2.0);
            dVar3 = pow(face_xyz[0] - gap_xyz[0],2.0);
            dVar4 = pow(face_xyz[1] - gap_xyz[1],2.0);
            face_xyz[2] = sqrt(dVar2 + dVar3 + dVar4);
            local_c0 = face_xyz[2];
            if (face_xyz[2] < *gap) {
              local_c0 = *gap;
            }
            *gap = local_c0;
          }
          type = ref_geom->ref_adj->item[type].next;
          if (type == -1) {
            local_c4 = -1;
          }
          else {
            local_c4 = ref_geom->ref_adj->item[type].ref;
          }
          local_30 = local_c4;
        }
        ref_geom_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xef4
             ,"ref_egads_gap",(ulong)ref_geom_local._4_4_,"n");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xef3,
           "ref_egads_gap",(ulong)ref_geom_local._4_4_,"n");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_egads_gap(REF_GEOM ref_geom, REF_INT node,
                                 REF_DBL *gap) {
  REF_INT item, geom, type;
  REF_DBL dist, face_xyz[3], gap_xyz[3];
  REF_BOOL has_node, has_edge;
  *gap = 0.0;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &has_node), "n");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &has_edge), "n");
  if (!has_edge) return REF_SUCCESS;

  if (has_node) {
    type = REF_GEOM_NODE;
  } else {
    type = REF_GEOM_FACE;
  }
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, gap_xyz, NULL), "eval");
    }
  }

  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, face_xyz, NULL), "eval");
      dist = sqrt(pow(face_xyz[0] - gap_xyz[0], 2) +
                  pow(face_xyz[1] - gap_xyz[1], 2) +
                  pow(face_xyz[2] - gap_xyz[2], 2));
      (*gap) = MAX((*gap), dist);
    }
  }

  return REF_SUCCESS;
}